

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O3

void opengv::relative_pose::modules::fivept_kneip::sPolynomial46
               (Matrix<double,_66,_197,_0,_66,_197> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  
  dVar1 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
          m_storage.m_data.array[0x29eb];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1552] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2bfb] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1594] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2c3d] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1618] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2cc1] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x165a] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2d03] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x16de] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2d87] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x18ac] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2dc9] / dVar1;
  dVar2 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
          m_storage.m_data.array[0x2b6b];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1dd4] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2ec5] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1e9a] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2e0b] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1edc] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2e4d] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1f1e] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2e8f] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1f60] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2ed1] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1fa2] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2f13] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1fe4] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2f55] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2026] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2f97] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x21f4] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2fd9] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2404] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x301b] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x28ea] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3093] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2a34] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x305d] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2a76] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x309f] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2ab8] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x30e1] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2afa] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x3123] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2b3c] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x3165] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2b7e] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x31a7] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2bc0] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x31e9] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2d8e] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x322b] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2f9e] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x326d] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x31f0] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x32af] / dVar1;
  return;
}

Assistant:

void
opengv::relative_pose::modules::fivept_kneip::sPolynomial46( Eigen::Matrix<double,66,197> & groebnerMatrix )
{
  groebnerMatrix(46,82) = -groebnerMatrix(39,170)/(groebnerMatrix(39,162));
  groebnerMatrix(46,83) = -groebnerMatrix(39,171)/(groebnerMatrix(39,162));
  groebnerMatrix(46,85) = -groebnerMatrix(39,173)/(groebnerMatrix(39,162));
  groebnerMatrix(46,86) = -groebnerMatrix(39,174)/(groebnerMatrix(39,162));
  groebnerMatrix(46,88) = -groebnerMatrix(39,176)/(groebnerMatrix(39,162));
  groebnerMatrix(46,95) = -groebnerMatrix(39,177)/(groebnerMatrix(39,162));
  groebnerMatrix(46,115) = groebnerMatrix(27,181)/(groebnerMatrix(27,168));
  groebnerMatrix(46,118) = -groebnerMatrix(39,178)/(groebnerMatrix(39,162));
  groebnerMatrix(46,119) = -groebnerMatrix(39,179)/(groebnerMatrix(39,162));
  groebnerMatrix(46,120) = -groebnerMatrix(39,180)/(groebnerMatrix(39,162));
  groebnerMatrix(46,121) = -groebnerMatrix(39,181)/(groebnerMatrix(39,162));
  groebnerMatrix(46,122) = -groebnerMatrix(39,182)/(groebnerMatrix(39,162));
  groebnerMatrix(46,123) = -groebnerMatrix(39,183)/(groebnerMatrix(39,162));
  groebnerMatrix(46,124) = -groebnerMatrix(39,184)/(groebnerMatrix(39,162));
  groebnerMatrix(46,131) = -groebnerMatrix(39,185)/(groebnerMatrix(39,162));
  groebnerMatrix(46,139) = -groebnerMatrix(39,186)/(groebnerMatrix(39,162));
  groebnerMatrix(46,158) = groebnerMatrix(27,188)/(groebnerMatrix(27,168));
  groebnerMatrix(46,163) = -groebnerMatrix(39,187)/(groebnerMatrix(39,162));
  groebnerMatrix(46,164) = -groebnerMatrix(39,188)/(groebnerMatrix(39,162));
  groebnerMatrix(46,165) = -groebnerMatrix(39,189)/(groebnerMatrix(39,162));
  groebnerMatrix(46,166) = -groebnerMatrix(39,190)/(groebnerMatrix(39,162));
  groebnerMatrix(46,167) = -groebnerMatrix(39,191)/(groebnerMatrix(39,162));
  groebnerMatrix(46,168) = -groebnerMatrix(39,192)/(groebnerMatrix(39,162));
  groebnerMatrix(46,169) = -groebnerMatrix(39,193)/(groebnerMatrix(39,162));
  groebnerMatrix(46,176) = -groebnerMatrix(39,194)/(groebnerMatrix(39,162));
  groebnerMatrix(46,184) = -groebnerMatrix(39,195)/(groebnerMatrix(39,162));
  groebnerMatrix(46,193) = -groebnerMatrix(39,196)/(groebnerMatrix(39,162));
}